

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.cpp
# Opt level: O3

string * nite::getCWD_abi_cxx11_(void)

{
  string *in_RDI;
  char local_1018 [8];
  char CurrentPath [4096];
  
  getcwd(local_1018,0x1000);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  strlen(local_1018);
  std::__cxx11::string::_M_construct<char_const*>();
  return in_RDI;
}

Assistant:

String nite::getCWD(){
	char CurrentPath[FILENAME_MAX];
	CWD(CurrentPath, sizeof(CurrentPath));
	return CurrentPath;
}